

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

uint32_t bcread_uleb128_33(LexState *ls)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uint local_1c;
  int sh;
  uint32_t v;
  uint8_t *p;
  LexState *ls_local;
  
  _sh = (byte *)(ls->p + 1);
  local_1c = (int)(uint)(byte)*ls->p >> 1;
  if (0x3f < local_1c) {
    bVar2 = 0xff;
    local_1c = local_1c & 0x3f;
    do {
      bVar2 = bVar2 + 7;
      local_1c = (*_sh & 0x7f) << (bVar2 & 0x1f) | local_1c;
      pbVar3 = _sh + 1;
      bVar1 = *_sh;
      _sh = pbVar3;
    } while (0x7f < bVar1);
  }
  ls->p = (char *)_sh;
  return local_1c;
}

Assistant:

static uint32_t bcread_uleb128_33(LexState *ls)
{
  const uint8_t *p = (const uint8_t *)ls->p;
  uint32_t v = (*p++ >> 1);
  if (LJ_UNLIKELY(v >= 0x40)) {
    int sh = -1;
    v &= 0x3f;
    do {
     v |= ((*p & 0x7f) << (sh += 7));
   } while (*p++ >= 0x80);
  }
  ls->p = (char *)p;
  lj_assertLS(ls->p <= ls->pe, "buffer read overflow");
  return v;
}